

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_State_PDU::Minefield_State_PDU
          (Minefield_State_PDU *this,EntityIdentifier *ID,KUINT16 SequenceNumber,ForceID FID,
          EntityType *Type,WorldCoordinates *Loc,EulerAngles *Ori,MinefieldAppearance *MA,
          MinefieldProtocolMode MPM)

{
  WorldCoordinates *Loc_local;
  EntityType *Type_local;
  ForceID FID_local;
  KUINT16 SequenceNumber_local;
  EntityIdentifier *ID_local;
  Minefield_State_PDU *this_local;
  
  Minefield_Header::Minefield_Header(&this->super_Minefield_Header);
  (this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Minefield_State_PDU_00330150;
  this->m_ui8ForceID = (KUINT8)FID;
  this->m_ui8NumPerimPoints = '\0';
  DATA_TYPE::EntityType::EntityType(&this->m_MinefieldType,Type);
  this->m_ui16NumMineTypes = 0;
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_Loc,Loc);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_Ori,Ori);
  DATA_TYPE::MinefieldAppearance::MinefieldAppearance(&this->m_App,MA);
  std::
  vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ::vector(&this->m_vPoints);
  std::vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>::vector
            (&this->m_vMineTypes);
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui8PDUType = '%';
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = 0x48;
  (this->m_SeqNumUnion).m_ui16SeqNum = SequenceNumber;
  (this->m_ui16ProtocolModeUnion).m_ui16ProtocolMode16 = (KUINT16)MPM;
  DATA_TYPE::EntityIdentifier::operator=(&(this->super_Minefield_Header).m_MinefieldID,ID);
  return;
}

Assistant:

Minefield_State_PDU::Minefield_State_PDU( const EntityIdentifier & ID, KUINT16 SequenceNumber, ForceID FID, const EntityType & Type,
        const WorldCoordinates & Loc, const EulerAngles & Ori, const MinefieldAppearance & MA,
        MinefieldProtocolMode MPM ) :
    m_ui8ForceID( FID ),
    m_ui8NumPerimPoints( 0 ),
    m_ui16NumMineTypes( 0 ),
    m_MinefieldType( Type ),
    m_Loc( Loc ),
    m_Ori( Ori ),
    m_App( MA )
{
    m_ui8PDUType = MinefieldState_PDU_Type;
    m_ui16PDULength = MINEFIELD_STATE_PDU_SIZE;
    m_SeqNumUnion.m_ui16SeqNum = SequenceNumber;
    m_ui16ProtocolModeUnion.m_ui16ProtocolMode16 = MPM;
    m_MinefieldID = ID;
}